

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

GLenum __thiscall
gl4cts::GPUShaderFP64Test2::getCapturedPrimitiveType
          (GPUShaderFP64Test2 *this,shaderStage shader_stage)

{
  return 0;
}

Assistant:

glw::GLenum GPUShaderFP64Test2::getCapturedPrimitiveType(shaderStage shader_stage) const
{
	switch (shader_stage)
	{
	case GEOMETRY_SHADER:
	case TESS_CTRL_SHADER:
	case TESS_EVAL_SHADER:
	case VERTEX_SHADER:
		return GL_POINTS;
		break;

	default:
		return GL_NONE;
		break;
	}
}